

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O0

btBroadphaseProxy * __thiscall
btSimpleBroadphase::createProxy
          (btSimpleBroadphase *this,btVector3 *aabbMin,btVector3 *aabbMax,int shapeType,
          void *userPtr,short collisionFilterGroup,short collisionFilterMask,btDispatcher *param_8,
          void *multiSapProxy)

{
  int iVar1;
  void *ptr;
  btVector3 *in_RDI;
  undefined2 in_R9W;
  void *in_stack_00000018;
  btSimpleBroadphaseProxy *proxy;
  int newHandleIndex;
  short in_stack_ffffffffffffff8e;
  btSimpleBroadphase *in_stack_ffffffffffffff90;
  btSimpleBroadphaseProxy *in_stack_ffffffffffffffb0;
  short in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffcc;
  btBroadphaseProxy *local_8;
  
  if ((int)in_RDI->m_floats[2] < (int)in_RDI->m_floats[3]) {
    iVar1 = allocHandle(in_stack_ffffffffffffff90);
    ptr = (void *)(*(long *)(in_RDI[1].m_floats + 2) + (long)iVar1 * 0x40);
    local_8 = (btBroadphaseProxy *)btBroadphaseProxy::operator_new(0x40,ptr);
    btSimpleBroadphaseProxy::btSimpleBroadphaseProxy
              (in_stack_ffffffffffffffb0,in_RDI,(btVector3 *)local_8,(int)((ulong)ptr >> 0x20),
               in_stack_00000018,in_stack_ffffffffffffff8e,in_stack_ffffffffffffffc0,
               (void *)CONCAT26(in_R9W,CONCAT24(in_stack_ffffffffffffffcc,iVar1)));
  }
  else {
    local_8 = (btBroadphaseProxy *)0x0;
  }
  return local_8;
}

Assistant:

btBroadphaseProxy*	btSimpleBroadphase::createProxy(  const btVector3& aabbMin,  const btVector3& aabbMax,int shapeType,void* userPtr ,short int collisionFilterGroup,short int collisionFilterMask, btDispatcher* /*dispatcher*/,void* multiSapProxy)
{
	if (m_numHandles >= m_maxHandles)
	{
		btAssert(0);
		return 0; //should never happen, but don't let the game crash ;-)
	}
	btAssert(aabbMin[0]<= aabbMax[0] && aabbMin[1]<= aabbMax[1] && aabbMin[2]<= aabbMax[2]);

	int newHandleIndex = allocHandle();
	btSimpleBroadphaseProxy* proxy = new (&m_pHandles[newHandleIndex])btSimpleBroadphaseProxy(aabbMin,aabbMax,shapeType,userPtr,collisionFilterGroup,collisionFilterMask,multiSapProxy);

	return proxy;
}